

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digraph.cc
# Opt level: O1

AdjVertex * __thiscall
bidirectional::DiGraph::getAdjVertex
          (AdjVertex *__return_storage_ptr__,DiGraph *this,LemonArc *arc,bool *forward)

{
  int iVar1;
  uint uVar2;
  pointer pVVar3;
  Value *pVVar4;
  uint *puVar5;
  long lVar6;
  uint *puVar7;
  uint *puVar8;
  uint *puVar9;
  char *pcVar10;
  long lVar11;
  
  pVVar3 = (this->vertices).
           super__Vector_base<bidirectional::Vertex,_std::allocator<bidirectional::Vertex>_>._M_impl
           .super__Vector_impl_data._M_start;
  lVar11 = *(long *)&(((vector<lemon::SmartDigraphBase::ArcT,_std::allocator<lemon::SmartDigraphBase::ArcT>_>
                        *)((long)&(((this->lemon_graph_ptr)._M_t.
                                    super___uniq_ptr_impl<lemon::SmartDigraph,_std::default_delete<lemon::SmartDigraph>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_lemon::SmartDigraph_*,_std::default_delete<lemon::SmartDigraph>_>
                                    .super__Head_base<0UL,_lemon::SmartDigraph_*,_false>.
                                   _M_head_impl)->super_ExtendedSmartDigraphBase).
                                  super_SmartDigraphBase + 0x18))->
                     super__Vector_base<lemon::SmartDigraphBase::ArcT,_std::allocator<lemon::SmartDigraphBase::ArcT>_>
                     )._M_impl;
  lVar6 = lVar11 + 4;
  if (*forward != false) {
    lVar6 = lVar11;
  }
  puVar7 = (uint *)(long)*(int *)(lVar6 + (long)arc->_id * 0x10);
  puVar8 = (uint *)((long)(this->vertices).
                          super__Vector_base<bidirectional::Vertex,_std::allocator<bidirectional::Vertex>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar3 >> 3);
  if (puVar7 < puVar8) {
    iVar1 = arc->_id;
    lVar11 = *(long *)&(((Container *)
                        ((long)&(((this->weight_map_ptr)._M_t.
                                  super___uniq_ptr_impl<lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>,_std::default_delete<lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_*,_std::default_delete<lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_>_>
                                  .
                                  super__Head_base<0UL,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_*,_false>
                                 ._M_head_impl)->
                                super_MapExtender<lemon::DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc,_double>_>
                                ).
                                super_DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc,_double>
                        + 0x18))->super__Vector_base<double,_std::allocator<double>_>)._M_impl;
    pVVar4 = *(Value **)
              ((long)&(((this->res_map_ptr)._M_t.
                        super___uniq_ptr_impl<lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<std::vector<double,_std::allocator<double>_>_>,_std::default_delete<lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<std::vector<double,_std::allocator<double>_>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<std::vector<double,_std::allocator<double>_>_>_*,_std::default_delete<lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<std::vector<double,_std::allocator<double>_>_>_>_>
                        .
                        super__Head_base<0UL,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<std::vector<double,_std::allocator<double>_>_>_*,_false>
                       ._M_head_impl)->
                      super_MapExtender<lemon::DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc,_std::vector<double,_std::allocator<double>_>_>_>
                      ).
                      super_DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc,_std::vector<double,_std::allocator<double>_>_>
              + 0x20);
    __return_storage_ptr__->vertex = pVVar3[(long)puVar7];
    __return_storage_ptr__->weight = *(double *)(lVar11 + (long)iVar1 * 8);
    std::vector<double,_std::allocator<double>_>::vector
              (&__return_storage_ptr__->resource_consumption,pVVar4 + iVar1);
    __return_storage_ptr__->init = true;
    return __return_storage_ptr__;
  }
  pcVar10 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",puVar7,
             puVar8);
  puVar8 = *(uint **)(pcVar10 + 0x30);
  puVar5 = *(uint **)(pcVar10 + 0x38);
  lVar11 = (long)puVar5 - (long)puVar8 >> 5;
  puVar9 = puVar8;
  if (0 < lVar11) {
    uVar2 = *puVar7;
    puVar9 = (uint *)(((long)puVar5 - (long)puVar8 & 0xffffffffffffffe0U) + (long)puVar8);
    lVar11 = lVar11 + 1;
    puVar8 = puVar8 + 4;
    do {
      if (puVar8[-3] == uVar2) {
        puVar8 = puVar8 + -4;
        goto LAB_001520db;
      }
      if (puVar8[-1] == uVar2) {
        puVar8 = puVar8 + -2;
        goto LAB_001520db;
      }
      if (puVar8[1] == uVar2) goto LAB_001520db;
      if (puVar8[3] == uVar2) {
        puVar8 = puVar8 + 2;
        goto LAB_001520db;
      }
      lVar11 = lVar11 + -1;
      puVar8 = puVar8 + 8;
    } while (1 < lVar11);
  }
  lVar11 = (long)puVar5 - (long)puVar9 >> 3;
  if (lVar11 != 1) {
    if (lVar11 != 2) {
      puVar8 = puVar5;
      if ((lVar11 != 3) || (puVar8 = puVar9, puVar9[1] == *puVar7)) goto LAB_001520db;
      puVar9 = puVar9 + 2;
    }
    puVar8 = puVar9;
    if (puVar9[1] == *puVar7) goto LAB_001520db;
    puVar9 = puVar9 + 2;
  }
  puVar8 = puVar9;
  if (puVar9[1] != *puVar7) {
    puVar8 = puVar5;
  }
LAB_001520db:
  return (AdjVertex *)(ulong)*puVar8;
}

Assistant:

AdjVertex DiGraph::getAdjVertex(const LemonArc& arc, const bool& forward)
    const {
  LemonNode node;
  if (forward) {
    node = head(arc);
  } else {
    node = tail(arc);
  }
  const Vertex&              vertex               = getVertexFromLNode(node);
  const double&              weight               = getWeight(arc);
  const std::vector<double>& resource_consumption = getRes(arc);
  return AdjVertex(vertex, weight, resource_consumption);
}